

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O1

ON_2dex ON_SubDQuadNeighborhood::CenterVertexDex(int vi)

{
  ON_2dex in_RAX;
  int jValue;
  int iValue;
  ON_2dex local_8;
  
  switch(vi) {
  case 0:
    iValue = 1;
    break;
  case 1:
    iValue = 2;
    break;
  case 2:
    iValue = 2;
    goto LAB_00625e30;
  case 3:
    iValue = 1;
LAB_00625e30:
    jValue = 2;
    goto LAB_00625e53;
  default:
    iValue = -0x7fffffff;
    jValue = -0x7fffffff;
    goto LAB_00625e53;
  }
  jValue = 1;
LAB_00625e53:
  local_8 = in_RAX;
  ON_2dex::ON_2dex(&local_8,iValue,jValue);
  return local_8;
}

Assistant:

const ON_2dex ON_SubDQuadNeighborhood::CenterVertexDex(
  int vi
)
{
  if (0 == vi)
    return ON_2dex(1, 1);
  if (1==vi)
    return ON_2dex(2, 1);
  if (2==vi)
    return ON_2dex(2, 2);
  if (3==vi)
    return ON_2dex(1, 2);
  return ON_2dex(ON_UNSET_INT_INDEX,ON_UNSET_INT_INDEX);
}